

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryRegister.cpp
# Opt level: O0

BndryRegister * __thiscall amrex::BndryRegister::operator+=(BndryRegister *this,BndryRegister *rhs)

{
  bool bVar1;
  void *pvVar2;
  long lVar3;
  BndryRegister *in_RDI;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<double> dfab;
  Array4<const_double> sfab;
  Box *bx;
  FabSetIter bfsi;
  int ncomp;
  Orientation f;
  OrientationIter face;
  BndryRegister *in_stack_fffffffffffffd78;
  FabSet *in_stack_fffffffffffffd80;
  int local_268;
  uint local_264;
  int local_260;
  int local_25c;
  Arena local_218;
  long local_200;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1d4;
  long local_1d0;
  long local_1c8;
  long local_1c0;
  long local_1b8;
  int local_1b0;
  int local_1ac;
  int local_1a8;
  undefined1 local_18c [44];
  undefined1 local_160 [104];
  Orientation local_f8;
  OrientationIter local_f4 [5];
  pointer local_e0;
  int local_d8;
  BndryRegister *local_d0;
  int local_c4;
  uint uStack_c0;
  int local_bc;
  double *local_b8;
  uint local_b0;
  BndryRegister *local_a8;
  int local_9c;
  BATType BStack_98;
  uint local_94;
  int local_90;
  int local_8c;
  uint local_88;
  int local_84;
  long *local_80;
  int local_78;
  int local_74;
  uint local_70;
  int local_6c;
  DataAllocator local_68;
  undefined4 local_5c;
  pointer local_58;
  undefined4 local_4c;
  pointer local_48;
  undefined4 local_3c;
  MultiArray4<double> local_38;
  undefined4 local_2c;
  BndryRegister *local_28;
  undefined4 local_1c;
  BndryRegister *local_18;
  undefined4 local_c;
  BndryRegister *local_8;
  
  OrientationIter::OrientationIter(local_f4);
  while (pvVar2 = OrientationIter::operator_cast_to_void_(local_f4), pvVar2 != (void *)0x0) {
    local_f8 = OrientationIter::operator()((OrientationIter *)in_stack_fffffffffffffd78);
    Orientation::operator_cast_to_int(&local_f8);
    local_160._100_4_ = FabSet::nComp((FabSet *)0x12f325f);
    local_18c._40_4_ = local_f8.val;
    operator[](in_stack_fffffffffffffd78,
               (Orientation)(int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
    FabSetIter::FabSetIter
              ((FabSetIter *)in_stack_fffffffffffffd80,(FabSet *)in_stack_fffffffffffffd78);
    while (bVar1 = MFIter::isValid((MFIter *)local_160), bVar1) {
      in_stack_fffffffffffffd78 = (BndryRegister *)local_18c;
      in_stack_fffffffffffffd80 = (FabSet *)local_160;
      MFIter::validbox((MFIter *)in_RDI);
      local_1d4 = local_f8.val;
      local_18c._28_8_ = in_stack_fffffffffffffd78;
      operator[](in_stack_fffffffffffffd78,
                 (Orientation)(int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
      FabSet::array(in_stack_fffffffffffffd80,(MFIter *)in_stack_fffffffffffffd78);
      Orientation::operator_cast_to_int(&local_f8);
      FabSet::array(in_stack_fffffffffffffd80,(MFIter *)in_stack_fffffffffffffd78);
      local_d0 = (BndryRegister *)local_18c._28_8_;
      local_8 = (BndryRegister *)local_18c._28_8_;
      local_c = 0;
      local_c4 = *(int *)local_18c._28_8_;
      local_18 = (BndryRegister *)local_18c._28_8_;
      local_1c = 1;
      uStack_c0 = *(uint *)(local_18c._28_8_ + 4);
      local_e0 = *(pointer *)local_18c._28_8_;
      local_28 = (BndryRegister *)local_18c._28_8_;
      local_2c = 2;
      local_d8 = *(int *)&(((FabSet *)(local_18c._28_8_ + 8))->m_mf).
                          super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase;
      local_a8 = (BndryRegister *)local_18c._28_8_;
      local_38.hp = (Array4<double> *)(local_18c._28_8_ + 0xc);
      local_3c = 0;
      local_9c = *(int *)&(local_38.hp)->p;
      local_48 = (pointer)(local_18c._28_8_ + 0xc);
      local_4c = 1;
      BStack_98 = (((BoxArray *)(local_18c._28_8_ + 0x10))->m_bat).m_bat_type;
      local_b8 = (local_38.hp)->p;
      local_58 = (pointer)(local_18c._28_8_ + 0xc);
      local_5c = 2;
      local_b0 = (((BATOp *)(local_18c._28_8_ + 0x14))->m_indexType).m_typ.itype;
      for (local_25c = 0; local_260 = local_d8, local_25c < (int)local_160._100_4_;
          local_25c = local_25c + 1) {
        for (; local_264 = uStack_c0, local_260 <= (int)local_b0; local_260 = local_260 + 1) {
          for (; local_268 = local_c4, (int)local_264 <= (int)BStack_98; local_264 = local_264 + 1)
          {
            for (; local_268 <= local_9c; local_268 = local_268 + 1) {
              local_84 = local_268;
              local_88 = local_264;
              local_8c = local_260;
              local_90 = local_25c;
              local_80 = &local_1d0;
              local_6c = local_268;
              local_70 = local_264;
              local_74 = local_260;
              local_78 = local_25c;
              local_68.m_arena = &local_218;
              lVar3 = (long)(local_268 - local_1f8) +
                      (int)(local_264 - local_1f4) * local_218.arena_info.release_threshold +
                      (long)(local_260 - local_1f0) * local_218.arena_info._8_8_ +
                      local_25c * local_200;
              local_218._vptr_Arena[lVar3] =
                   (_func_int *)
                   (*(double *)
                     (local_1d0 +
                     ((long)(local_268 - local_1b0) + (int)(local_264 - local_1ac) * local_1c8 +
                      (local_260 - local_1a8) * local_1c0 + local_25c * local_1b8) * 8) +
                   (double)local_218._vptr_Arena[lVar3]);
            }
          }
        }
      }
      local_bc = local_d8;
      local_94 = local_b0;
      MFIter::operator++((MFIter *)local_160);
    }
    FabSetIter::~FabSetIter((FabSetIter *)0x12f32b6);
    OrientationIter::operator++(local_f4);
  }
  return in_RDI;
}

Assistant:

BndryRegister&
BndryRegister::operator+= (const BndryRegister& rhs)
{
    BL_ASSERT(grids == rhs.grids);
    for (OrientationIter face; face; ++face) {
        const auto f = face();
        const int ncomp = bndry[f].nComp();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (FabSetIter bfsi(rhs[f]); bfsi.isValid(); ++bfsi) {
            const Box& bx = bfsi.validbox();
            auto const sfab =   rhs[f].array(bfsi);
            auto       dfab = bndry[f].array(bfsi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                dfab(i,j,k,n) += sfab(i,j,k,n);
            });
        }
    }
    return *this;
}